

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object __thiscall
pybind11::detail::accessor_policies::tuple_item::get(tuple_item *this,handle obj,size_t index)

{
  PyObject **ppPVar1;
  error_already_set *this_00;
  handle local_40 [3];
  PyObject *local_28;
  PyObject *result;
  size_t index_local;
  handle obj_local;
  
  result = (PyObject *)index;
  index_local = (size_t)obj.m_ptr;
  obj_local.m_ptr = (PyObject *)this;
  ppPVar1 = handle::ptr((handle *)&index_local);
  local_28 = (PyObject *)PyTuple_GetItem(*ppPVar1,result);
  if (local_28 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle(local_40,local_28);
  reinterpret_borrow<pybind11::object>((pybind11 *)this,local_40[0]);
  return (object)(handle)this;
}

Assistant:

static object get(handle obj, size_t index) {
        PyObject *result = PyTuple_GetItem(obj.ptr(), static_cast<ssize_t>(index));
        if (!result) { throw error_already_set(); }
        return reinterpret_borrow<object>(result);
    }